

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdevicediscovery_p.cpp
# Opt level: O2

void QDeviceDiscovery::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QDeviceDiscovery::*)(QString_const&)>
                      ((QtMocHelpers *)_a,(void **)deviceDetected,0,0);
    if (!bVar1) {
      QtMocHelpers::indexOfMethod<void(QDeviceDiscovery::*)(QString_const&)>
                ((QtMocHelpers *)_a,(void **)deviceRemoved,0,1);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      deviceRemoved((QDeviceDiscovery *)_o,(QString *)_a[1]);
      return;
    }
    if (_id == 0) {
      deviceDetected((QDeviceDiscovery *)_o,(QString *)_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QDeviceDiscovery::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDeviceDiscovery *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->deviceDetected((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->deviceRemoved((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDeviceDiscovery::*)(const QString & )>(_a, &QDeviceDiscovery::deviceDetected, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDeviceDiscovery::*)(const QString & )>(_a, &QDeviceDiscovery::deviceRemoved, 1))
            return;
    }
}